

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O1

bool __thiscall miniros::master::NetAdapter::hasAccessTo(NetAdapter *this,HostInfo *host)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  _Base_ptr p_Var4;
  
  p_Var4 = (host->addresses)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    bVar1 = (_Rb_tree_header *)p_Var4 != &(host->addresses)._M_t._M_impl.super__Rb_tree_header;
    if (!bVar1) {
      return bVar1;
    }
    bVar2 = network::NetAddress::isLocal((NetAddress *)(p_Var4 + 1));
    cVar3 = '\x03';
    if (!bVar2) {
      cVar3 = matchNetAddress(this,(NetAddress *)(p_Var4 + 1));
    }
    if ((cVar3 != '\x03') && (cVar3 != '\0')) break;
    p_Var4 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
  }
  return bVar1;
}

Assistant:

bool NetAdapter::hasAccessTo(const HostInfo& host) const
{
  for (const auto& address: host.addresses) {
    if (address.isLocal())
      continue;
    if (matchNetAddress(address))
      return true;
  }
  return false;
}